

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O0

void anon_unknown.dwarf_47f3d::testMatrix(M44f *M)

{
  bool bVar1;
  ostream *poVar2;
  float *pfVar3;
  void *pvVar4;
  Vec3<float> *in_RDI;
  Matrix44<float> *this;
  float extraout_XMM0_Da;
  int k;
  int j;
  M44f D;
  M44f N;
  V3f t;
  V3f r;
  V3f h;
  V3f s;
  undefined1 in_stack_ffffffffffffff2f;
  Vec3<float> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  int iVar5;
  undefined4 in_stack_ffffffffffffff44;
  int i;
  Vec3<float> *in_stack_ffffffffffffff48;
  Matrix44<float> *in_stack_ffffffffffffff50;
  Matrix44<float> *in_stack_ffffffffffffff70;
  Matrix44<float> *in_stack_ffffffffffffff78;
  Vec3<float> *in_stack_ffffffffffffffa8;
  Matrix44<float> *in_stack_ffffffffffffffb0;
  Vec3<float> local_38;
  Vec3<float> local_2c;
  Vec3<float> local_20;
  Vec3<float> local_14;
  
  Imath_3_2::Vec3<float>::Vec3(&local_14);
  Imath_3_2::Vec3<float>::Vec3(&local_20);
  Imath_3_2::Vec3<float>::Vec3(&local_2c);
  Imath_3_2::Vec3<float>::Vec3(&local_38);
  bVar1 = Imath_3_2::extractSHRT<float>
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_RDI,in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to extractSHRT");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testExtractSHRT.cpp"
                  ,0xd4,"void (anonymous namespace)::testMatrix(const M44f)");
  }
  Imath_3_2::Matrix44<float>::Matrix44((Matrix44<float> *)&stack0xffffffffffffff88);
  Imath_3_2::Matrix44<float>::translate<float>
            ((Matrix44<float> *)&stack0xffffffffffffff88,&local_38);
  Imath_3_2::Matrix44<float>::rotate<float>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Imath_3_2::Matrix44<float>::shear<float>((Matrix44<float> *)&stack0xffffffffffffff88,&local_20);
  Imath_3_2::Matrix44<float>::scale<float>((Matrix44<float> *)&stack0xffffffffffffff88,&local_14);
  Imath_3_2::Matrix44<float>::operator-(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  i = 0;
  do {
    if (3 < i) {
      return;
    }
    for (iVar5 = 0; iVar5 < 4; iVar5 = iVar5 + 1) {
      this = (Matrix44<float> *)&stack0xffffffffffffff48;
      Imath_3_2::Matrix44<float>::operator[](this,i);
      std::abs((int)this);
      if (1e-05 < extraout_XMM0_Da) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        pfVar3 = Imath_3_2::Matrix44<float>::operator[]
                           ((Matrix44<float> *)&stack0xffffffffffffff48,i);
        pvVar4 = (void *)std::ostream::operator<<(poVar2,pfVar3[iVar5]);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,i);
        poVar2 = std::operator<<(poVar2," ");
        pvVar4 = (void *)std::ostream::operator<<(poVar2,iVar5);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"M\n");
        poVar2 = Imath_3_2::operator<<((ostream *)N.x[1]._0_8_,(Matrix44<float> *)N.x[0]._8_8_);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"N\n");
        poVar2 = Imath_3_2::operator<<((ostream *)N.x[1]._0_8_,(Matrix44<float> *)N.x[0]._8_8_);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"D\n");
        poVar2 = Imath_3_2::operator<<((ostream *)N.x[1]._0_8_,(Matrix44<float> *)N.x[0]._8_8_);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testExtractSHRT.cpp"
                      ,0xfa,"void (anonymous namespace)::testMatrix(const M44f)");
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void
testMatrix (const M44f M)
{
    //
    // Extract Euler angles from M, and convert the
    // Euler angles back to a matrix, N.
    //

    V3f s, h, r, t;

    if (!extractSHRT (M, s, h, r, t, true))
    {
        cout << "Unable to extractSHRT" << std::endl;
        assert (false);
    }

    M44f N;

    N.translate (t); // ... matrix compositions
    N.rotate (r);
    N.shear (h);
    N.scale (s);

    debug (("Re-scale: %f %f %f\n", s[0], s[1], s[2]));
    debug (("Re-shear: %f %f %f\n", h[0], h[1], h[2]));
    debug (("Re-rot  : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Re-trans: %f %f %f\n", t[0], t[1], t[2]));

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M44f D (M - N);

    for (int j = 0; j < 4; ++j)
    {
        for (int k = 0; k < 4; ++k)
        {
            if (abs (D[j][k]) > 0.00001)
            {
                cout << "unexpectedly large matrix to "
                        "euler angles conversion error: "
                     << D[j][k] << endl;

                cout << j << " " << k << endl;

                cout << "M\n" << M << endl;
                cout << "N\n" << N << endl;
                cout << "D\n" << D << endl;

                assert (false);
            }
        }
    }
}